

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O2

void zzSqr(word *b,word *a,size_t n,void *stack)

{
  ulong *puVar1;
  word wVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  word *pwVar12;
  word *pwVar13;
  long lVar14;
  ulong *puVar15;
  
  wwSetZero(b,n * 2);
  pwVar12 = a;
  pwVar13 = b;
  sVar10 = 0;
  while (sVar10 != n) {
    uVar11 = 0;
    for (lVar14 = 1; auVar7._8_8_ = 0, auVar7._0_8_ = uVar11, sVar10 + lVar14 < n;
        lVar14 = lVar14 + 1) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = pwVar12[lVar14];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = a[sVar10];
      auVar7 = auVar3 * auVar5 + auVar7;
      uVar9 = auVar7._0_8_;
      puVar15 = pwVar13 + lVar14;
      uVar11 = *puVar15;
      *puVar15 = *puVar15 + uVar9;
      uVar11 = auVar7._8_8_ + (ulong)CARRY8(uVar11,uVar9);
    }
    b[sVar10 + n] = uVar11;
    pwVar13 = pwVar13 + 2;
    pwVar12 = pwVar12 + 1;
    sVar10 = sVar10 + 1;
  }
  uVar11 = 0;
  for (sVar10 = 0; n * 2 != sVar10; sVar10 = sVar10 + 1) {
    wVar2 = uVar11 + b[sVar10] * 2;
    uVar11 = b[sVar10] >> 0x3f;
    b[sVar10] = wVar2;
  }
  puVar15 = b + 1;
  for (sVar10 = 0; auVar8._8_8_ = 0, auVar8._0_8_ = uVar11, n != sVar10; sVar10 = sVar10 + 1) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = a[sVar10];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = a[sVar10];
    auVar8 = auVar4 * auVar6 + auVar8;
    uVar9 = auVar8._0_8_;
    puVar1 = puVar15 + -1;
    uVar11 = *puVar1;
    *puVar1 = *puVar1 + uVar9;
    uVar9 = auVar8._8_8_ + (ulong)CARRY8(uVar11,uVar9);
    uVar11 = *puVar15;
    *puVar15 = *puVar15 + uVar9;
    uVar11 = (ulong)CARRY8(uVar11,uVar9);
    puVar15 = puVar15 + 2;
  }
  return;
}

Assistant:

void zzSqr(word b[], const word a[], size_t n, void* stack)
{
	register word carry = 0;
	register word carry1;
	register dword prod;
	size_t i, j;
	ASSERT(wwIsDisjoint2(a, n, b, n + n));
	// b <- \sum_{i < j} a_i a_j B^{i + j}
	wwSetZero(b, n + n);
	for (i = 0; i < n; ++i)
	{
		for (j = i + 1; j < n; ++j)
		{
			zzMul11(prod, a[i], a[j]);
			prod += carry;
			prod += b[i + j];
			b[i + j] = (word)prod;
			carry = (word)(prod >> B_PER_W);
		}
		b[i + j] = carry;
		carry = 0;
	}
	// b <- 2 b
	for (i = 0; i < n + n; ++i)
	{
		carry1 = b[i] >> (B_PER_W - 1);
		b[i] = (b[i] << 1) | carry;
		carry = carry1;
	}
	// b <- b + \sum_i a_i^2 B^{i + i}
	for (i = 0; i < n; ++i)
	{
		zzMul11(prod, a[i], a[i]);
		prod += carry;
		prod += b[i + i];
		b[i + i] = (word)prod;
		prod >>= B_PER_W;
		prod += b[i + i + 1];
		b[i + i + 1] = (word)prod;
		carry = (word)(prod >> B_PER_W);
	}
	prod = 0;
	carry = carry1 = 0;
}